

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.h
# Opt level: O0

grid_iterator<int> *
idx2::End<int>(grid_iterator<int> *__return_storage_ptr__,grid *Grid,volume *Vol)

{
  u64 uVar1;
  grid_iterator<int> *Iter;
  int local_2e4;
  int iStack_2e0;
  undefined4 local_270;
  undefined4 uStack_26c;
  int local_260;
  int iStack_25c;
  v3i To3;
  volume *Vol_local;
  grid *Grid_local;
  int local_154;
  int iStack_150;
  undefined4 local_a8;
  undefined4 uStack_a4;
  int local_28;
  int iStack_24;
  
  grid_iterator<int>::grid_iterator(__return_storage_ptr__);
  uVar1 = (Grid->super_extent).From;
  local_154 = ((int)uVar1 << 0xb) >> 0xb;
  iStack_150 = (int)((long)(uVar1 << 0x16) >> 0x2b);
  local_270 = (undefined4)_local_154;
  uStack_26c = (undefined4)((ulong)_local_154 >> 0x20);
  local_a8 = local_270;
  uStack_a4 = uStack_26c;
  local_28 = ((int)Vol->Dims << 0xb) >> 0xb;
  iStack_24 = (int)((long)(Vol->Dims << 0x16) >> 0x2b);
  local_2e4 = (int)_local_28;
  iStack_2e0 = (int)((ulong)_local_28 >> 0x20);
  iStack_25c = (int)((ulong)_local_a8 >> 0x20);
  local_260 = (int)_local_a8;
  __return_storage_ptr__->Ptr =
       (int *)((Vol->Buffer).Data +
              ((long)((int)((long)(uVar1 * 2) >> 0x2b) +
                     (int)((long)((Grid->super_extent).Dims * 2) >> 0x2b) *
                     (int)((long)(Grid->Strd * 2) >> 0x2b)) * (long)local_2e4 * (long)iStack_2e0 +
               (long)iStack_25c * (long)local_2e4 + (long)local_260) * 4);
  return __return_storage_ptr__;
}

Assistant:

grid_iterator<t>
End(const grid& Grid, const volume& Vol)
{
  grid_iterator<t> Iter;
  v3i To3 = From(Grid) + v3i(0, 0, Dims(Grid).Z * Strd(Grid).Z);
  Iter.Ptr = (t*)const_cast<byte*>(Vol.Buffer.Data) + Row(Dims(Vol), To3);
  return Iter;
}